

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O0

void cdef_params_init(YV12_BUFFER_CONFIG *frame,YV12_BUFFER_CONFIG *ref,AV1_COMMON *cm,
                     MACROBLOCKD *xd,CdefSearchCtx *cdef_search_ctx,CDEF_PICK_METHOD pick_method)

{
  int iVar1;
  long in_RCX;
  AV1_COMMON *in_RDX;
  undefined8 in_RSI;
  YV12_BUFFER_CONFIG *in_RDI;
  undefined8 *in_R8;
  uint in_R9D;
  BLOCK_SIZE unaff_retaddr;
  macroblockd_plane *in_stack_00000008;
  int pli;
  int num_planes;
  CommonModeInfoParams *mi_params;
  undefined4 local_48;
  int local_44;
  int local_40;
  AV1_COMMON *pAVar2;
  
  pAVar2 = in_RDX;
  iVar1 = av1_num_planes(in_RDX);
  in_R8[1] = &pAVar2->mi_params;
  *in_R8 = in_RSI;
  *(int *)(in_R8 + 0x3e0) = ((in_RDX->mi_params).mi_rows + 0xf) / 0x10;
  *(int *)((long)in_R8 + 0x1f04) = ((in_RDX->mi_params).mi_cols + 0xf) / 0x10;
  if (pAVar2->seq_params->bit_depth == AOM_BITS_8) {
    local_44 = 0;
  }
  else {
    local_44 = pAVar2->seq_params->bit_depth - AOM_BITS_8;
  }
  *(int *)((long)in_R8 + 0x1eb4) = local_44;
  *(int *)(in_R8 + 0x3d7) = ((pAVar2->quant_params).base_qindex >> 6) + 3;
  *(int *)(in_R8 + 0x3d6) = nb_cdef_strengths[in_R9D];
  *(int *)(in_R8 + 0x3d8) = iVar1;
  *(uint *)((long)in_R8 + 0x1ebc) = in_R9D;
  *(undefined4 *)(in_R8 + 0x3e4) = 0;
  *(bool *)((long)in_R8 + 0x1f24) = pAVar2->seq_params->use_highbitdepth != '\0';
  av1_setup_dst_planes
            (in_stack_00000008,unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
             (int)((ulong)pAVar2 >> 0x20),(int)cdef_search_ctx);
  for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
    *(undefined4 *)((long)in_R8 + (long)local_40 * 4 + 0x1edc) =
         *(undefined4 *)(in_RCX + (long)local_40 * 0xa30 + 0x14);
    *(undefined4 *)((long)in_R8 + (long)local_40 * 4 + 0x1ee8) =
         *(undefined4 *)(in_RCX + (long)local_40 * 0xa30 + 0x18);
    if (*(int *)((long)in_R8 + (long)local_40 * 4 + 0x1ee8) == 0) {
      local_48 = 3;
      if (*(int *)((long)in_R8 + (long)local_40 * 4 + 0x1edc) != 0) {
        local_48 = 1;
      }
    }
    else {
      local_48 = 2;
      if (*(int *)((long)in_R8 + (long)local_40 * 4 + 0x1edc) != 0) {
        local_48 = 0;
      }
    }
    *(undefined4 *)((long)in_R8 + (long)local_40 * 4 + 0x1ef4) = local_48;
    *(int *)((long)in_R8 + (long)local_40 * 4 + 0x1ec4) =
         2 - *(int *)(in_RCX + (long)local_40 * 0xa30 + 0x14);
    *(int *)((long)in_R8 + (long)local_40 * 4 + 0x1ed0) =
         2 - *(int *)(in_RCX + (long)local_40 * 0xa30 + 0x18);
    memcpy(in_R8 + (long)local_40 * 0x146 + 2,(void *)(in_RCX + 0x10 + (long)local_40 * 0xa30),0xa30
          );
  }
  if (pAVar2->seq_params->use_highbitdepth == '\0') {
    in_R8[0x3d4] = av1_cdef_copy_sb8_16_lowbd;
    in_R8[0x3d5] = compute_cdef_dist;
  }
  else {
    in_R8[0x3d4] = av1_cdef_copy_sb8_16_highbd;
    in_R8[0x3d5] = compute_cdef_dist_highbd;
  }
  return;
}

Assistant:

static inline void cdef_params_init(const YV12_BUFFER_CONFIG *frame,
                                    const YV12_BUFFER_CONFIG *ref,
                                    AV1_COMMON *cm, MACROBLOCKD *xd,
                                    CdefSearchCtx *cdef_search_ctx,
                                    CDEF_PICK_METHOD pick_method) {
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int num_planes = av1_num_planes(cm);
  cdef_search_ctx->mi_params = &cm->mi_params;
  cdef_search_ctx->ref = ref;
  cdef_search_ctx->nvfb =
      (mi_params->mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  cdef_search_ctx->nhfb =
      (mi_params->mi_cols + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  cdef_search_ctx->coeff_shift = AOMMAX(cm->seq_params->bit_depth - 8, 0);
  cdef_search_ctx->damping = 3 + (cm->quant_params.base_qindex >> 6);
  cdef_search_ctx->total_strengths = nb_cdef_strengths[pick_method];
  cdef_search_ctx->num_planes = num_planes;
  cdef_search_ctx->pick_method = pick_method;
  cdef_search_ctx->sb_count = 0;
  cdef_search_ctx->use_highbitdepth = cm->seq_params->use_highbitdepth;
  av1_setup_dst_planes(xd->plane, cm->seq_params->sb_size, frame, 0, 0, 0,
                       num_planes);
  // Initialize plane wise information.
  for (int pli = 0; pli < num_planes; pli++) {
    cdef_search_ctx->xdec[pli] = xd->plane[pli].subsampling_x;
    cdef_search_ctx->ydec[pli] = xd->plane[pli].subsampling_y;
    cdef_search_ctx->bsize[pli] =
        cdef_search_ctx->ydec[pli]
            ? (cdef_search_ctx->xdec[pli] ? BLOCK_4X4 : BLOCK_8X4)
            : (cdef_search_ctx->xdec[pli] ? BLOCK_4X8 : BLOCK_8X8);
    cdef_search_ctx->mi_wide_l2[pli] =
        MI_SIZE_LOG2 - xd->plane[pli].subsampling_x;
    cdef_search_ctx->mi_high_l2[pli] =
        MI_SIZE_LOG2 - xd->plane[pli].subsampling_y;
    cdef_search_ctx->plane[pli] = xd->plane[pli];
  }
  // Function pointer initialization.
#if CONFIG_AV1_HIGHBITDEPTH
  if (cm->seq_params->use_highbitdepth) {
    cdef_search_ctx->copy_fn = av1_cdef_copy_sb8_16_highbd;
    cdef_search_ctx->compute_cdef_dist_fn = compute_cdef_dist_highbd;
  } else {
    cdef_search_ctx->copy_fn = av1_cdef_copy_sb8_16_lowbd;
    cdef_search_ctx->compute_cdef_dist_fn = compute_cdef_dist;
  }
#else
  cdef_search_ctx->copy_fn = av1_cdef_copy_sb8_16_lowbd;
  cdef_search_ctx->compute_cdef_dist_fn = compute_cdef_dist;
#endif
}